

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t XXH3_len_0to16_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  xxh_u64 xVar2;
  ulong uVar3;
  xxh_u64 xVar4;
  xxh_u8 *in_RCX;
  size_t in_RDX;
  xxh_u8 *in_RSI;
  size_t in_RDI;
  XXH128_hash_t XVar5;
  xxh_u8 *unaff_retaddr;
  xxh_u64 bitfliph;
  xxh_u64 bitflipl;
  XXH128_hash_t h128;
  XXH64_hash_t in_stack_ffffffffffffffc8;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  if (in_RSI < (xxh_u8 *)0x9) {
    if (in_RSI < (xxh_u8 *)0x4) {
      if (in_RSI == (xxh_u8 *)0x0) {
        xVar1 = XXH_readLE64((void *)0x12af36);
        xVar2 = XXH_readLE64((void *)0x12af49);
        uVar3 = xVar1 ^ xVar2;
        xVar1 = XXH_readLE64((void *)0x12af67);
        xVar2 = XXH_readLE64((void *)0x12af7a);
        xVar4 = XXH64_avalanche((ulong)in_RCX ^ uVar3);
        xVar1 = XXH64_avalanche((ulong)in_RCX ^ xVar1 ^ xVar2);
        XVar5.high64 = xVar1;
        XVar5.low64 = xVar4;
      }
      else {
        XVar5 = XXH3_len_1to3_128b(in_stack_fffffffffffffff0._0_8_,in_RDI,in_RSI,in_RDX);
      }
    }
    else {
      XVar5 = XXH3_len_4to8_128b(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffc8);
    }
  }
  else {
    XVar5 = XXH3_len_9to16_128b(unaff_retaddr,in_stack_fffffffffffffff0._8_8_,
                                in_stack_fffffffffffffff0._0_8_,in_RDI);
  }
  return XVar5;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t XXH3_len_0to16_128b(const xxh_u8* input,
                                                   size_t len,
                                                   const xxh_u8* secret,
                                                   XXH64_hash_t seed) {
  XXH_ASSERT(len <= 16);
  {
    if (len > 8) return XXH3_len_9to16_128b(input, len, secret, seed);
    if (len >= 4) return XXH3_len_4to8_128b(input, len, secret, seed);
    if (len) return XXH3_len_1to3_128b(input, len, secret, seed);
    {
      XXH128_hash_t h128;
      xxh_u64 const bitflipl =
          XXH_readLE64(secret + 64) ^ XXH_readLE64(secret + 72);
      xxh_u64 const bitfliph =
          XXH_readLE64(secret + 80) ^ XXH_readLE64(secret + 88);
      h128.low64 = XXH64_avalanche(seed ^ bitflipl);
      h128.high64 = XXH64_avalanche(seed ^ bitfliph);
      return h128;
    }
  }
}